

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::genDataHandler(CppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  size_t sVar6;
  TDNode *pTVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  long *plVar11;
  undefined8 uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string header;
  ofstream ofs;
  string local_430;
  string local_410;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  long lStack_3b8;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  undefined8 uStack_398;
  ulong *local_390;
  long local_388;
  ulong local_380;
  long lStack_378;
  ulong *local_370;
  long local_368;
  ulong local_360;
  undefined8 uStack_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_3b0 = &local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"#ifndef INCLUDE_DATAHANDLER_HPP_\n","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_380 = *puVar8;
    lStack_378 = plVar3[3];
    local_390 = &local_380;
  }
  else {
    local_380 = *puVar8;
    local_390 = (ulong *)*plVar3;
  }
  local_388 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_390);
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_360 = *puVar8;
    uStack_358 = puVar4[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar8;
    local_370 = (ulong *)*puVar4;
  }
  local_368 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_320 = *puVar9;
    uStack_318 = puVar4[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar9;
    local_330 = (undefined8 *)*puVar4;
  }
  local_328 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_3c0 = *puVar8;
    lStack_3b8 = plVar3[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar8;
    local_3d0 = (ulong *)*plVar3;
  }
  local_3c8 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d0);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_3e0 = *plVar3;
    lStack_3d8 = puVar4[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar3;
    local_3f0 = (long *)*puVar4;
  }
  local_3e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar8 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410.field_2._8_8_ = plVar3[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_410._M_string_length = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_410);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar10 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430.field_2._8_8_ = plVar3[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_430._M_string_length = plVar3[1];
  *plVar3 = (long)psVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_430);
  plVar11 = plVar3 + 2;
  if ((long *)*plVar3 == plVar11) {
    local_220 = *plVar11;
    lStack_218 = plVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar11;
    local_230 = (long *)*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)plVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_2f0 = &local_2e0;
  plVar11 = plVar3 + 2;
  if ((long *)*plVar3 == plVar11) {
    local_2e0 = *plVar11;
    lStack_2d8 = plVar3[3];
  }
  else {
    local_2e0 = *plVar11;
    local_2f0 = (long *)*plVar3;
  }
  local_2e8 = plVar3[1];
  *plVar3 = (long)plVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (multifaq::cppgen::MICRO_BENCH != '\x01') goto LAB_001f3fb2;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\x03');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2b2810);
  local_310 = &local_300;
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = plVar3[3];
  }
  else {
    local_300 = *puVar8;
    local_310 = (ulong *)*plVar3;
  }
  local_308 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_350 = &local_340;
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_340 = *puVar8;
    lStack_338 = plVar3[3];
  }
  else {
    local_340 = *puVar8;
    local_350 = (ulong *)*plVar3;
  }
  local_348 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x03');
  uVar13 = 0xf;
  if (local_350 != &local_340) {
    uVar13 = local_340;
  }
  if (uVar13 < (ulong)(local_2c8 + local_348)) {
    uVar13 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar13 = local_2c0[0];
    }
    if (uVar13 < (ulong)(local_2c8 + local_348)) goto LAB_001f3288;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_001f3288:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2d0);
  }
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_3a0 = *puVar8;
    uStack_398 = puVar4[3];
    local_3b0 = &local_3a0;
  }
  else {
    local_3a0 = *puVar8;
    local_3b0 = (ulong *)*puVar4;
  }
  local_3a8 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b0);
  local_390 = &local_380;
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_380 = *puVar8;
    lStack_378 = puVar4[3];
  }
  else {
    local_380 = *puVar8;
    local_390 = (ulong *)*puVar4;
  }
  local_388 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,'\x03');
  uVar13 = 0xf;
  if (local_390 != &local_380) {
    uVar13 = local_380;
  }
  if (uVar13 < (ulong)(local_268 + local_388)) {
    uVar13 = 0xf;
    if (local_270 != local_260) {
      uVar13 = local_260[0];
    }
    if (uVar13 < (ulong)(local_268 + local_388)) goto LAB_001f33e3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_390);
  }
  else {
LAB_001f33e3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_270);
  }
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_360 = *puVar8;
    uStack_358 = puVar4[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar8;
    local_370 = (ulong *)*puVar4;
  }
  local_368 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_320 = *puVar9;
    uStack_318 = puVar4[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar9;
    local_330 = (undefined8 *)*puVar4;
  }
  local_328 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_3c0 = *puVar8;
    lStack_3b8 = puVar4[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar8;
    local_3d0 = (ulong *)*puVar4;
  }
  local_3c8 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,'\x03');
  uVar13 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar13 = local_3c0;
  }
  if (uVar13 < (ulong)(local_288 + local_3c8)) {
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < (ulong)(local_288 + local_3c8)) goto LAB_001f3579;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_001f3579:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_290);
  }
  local_3f0 = &local_3e0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_3e0 = *plVar3;
    lStack_3d8 = puVar4[3];
  }
  else {
    local_3e0 = *plVar3;
    local_3f0 = (long *)*puVar4;
  }
  local_3e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar8 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410.field_2._8_8_ = plVar3[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_410._M_string_length = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x03');
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar12 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_2a8 + local_410._M_string_length) {
    uVar13 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar13 = local_2a0[0];
    }
    if (uVar13 < local_2a8 + local_410._M_string_length) goto LAB_001f36ab;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_410._M_dataplus._M_p);
  }
  else {
LAB_001f36ab:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_2b0);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar10 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430.field_2._8_8_ = puVar4[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_430._M_string_length = puVar4[1];
  *puVar4 = psVar10;
  puVar4[1] = 0;
  *(undefined1 *)psVar10 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = puVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"#define BEGIN_MICRO_BENCH(timer) begin_##timer = ","");
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = puVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_390 = &local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"#define END_MICRO_BENCH(timer) finish_##timer = ","");
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_390);
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_360 = *puVar8;
    uStack_358 = puVar4[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar8;
    local_370 = (ulong *)*puVar4;
  }
  local_368 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_3b0 = &local_3a0;
  std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x03');
  uVar13 = 0xf;
  if (local_370 != &local_360) {
    uVar13 = local_360;
  }
  if (uVar13 < (ulong)(local_3a8 + local_368)) {
    uVar13 = 0xf;
    if (local_3b0 != &local_3a0) {
      uVar13 = local_3a0;
    }
    if (uVar13 < (ulong)(local_3a8 + local_368)) goto LAB_001f3ab5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_370);
  }
  else {
LAB_001f3ab5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_3b0);
  }
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_320 = *puVar9;
    uStack_318 = puVar4[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar9;
    local_330 = (undefined8 *)*puVar4;
  }
  local_328 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar8 = puVar4 + 2;
  local_350 = &local_340;
  if ((ulong *)*puVar4 == puVar8) {
    local_3c0 = *puVar8;
    lStack_3b8 = puVar4[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar8;
    local_3d0 = (ulong *)*puVar4;
  }
  local_3c8 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x03');
  uVar13 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar13 = local_3c0;
  }
  if (uVar13 < (ulong)(local_348 + local_3c8)) {
    uVar13 = 0xf;
    if (local_350 != &local_340) {
      uVar13 = local_340;
    }
    if (uVar13 < (ulong)(local_348 + local_3c8)) goto LAB_001f3bf3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_001f3bf3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_350);
  }
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_3e0 = *plVar3;
    lStack_3d8 = puVar4[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar3;
    local_3f0 = (long *)*puVar4;
  }
  local_3e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar8 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410.field_2._8_8_ = puVar4[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar8;
    local_410._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_410._M_string_length = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_310 = &local_300;
  std::__cxx11::string::_M_construct((ulong)&local_310,'\x03');
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar12 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_308 + local_410._M_string_length) {
    uVar13 = 0xf;
    if (local_310 != &local_300) {
      uVar13 = local_300;
    }
    if (uVar13 < local_308 + local_410._M_string_length) goto LAB_001f3d28;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_310,0,(char *)0x0,(ulong)local_410._M_dataplus._M_p);
  }
  else {
LAB_001f3d28:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_310);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar10 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430.field_2._8_8_ = puVar4[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_430._M_string_length = puVar4[1];
  *puVar4 = psVar10;
  puVar4[1] = 0;
  *(undefined1 *)psVar10 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = puVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"#define PRINT_MICRO_BENCH(timer) std::cout << ","");
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = puVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
LAB_001f3fb2:
  local_3d0 = &local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x03');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x2b2aa5);
  paVar1 = &local_410.field_2;
  plVar11 = plVar3 + 2;
  if ((long *)*plVar3 == plVar11) {
    local_3e0 = *plVar11;
    lStack_3d8 = plVar3[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar11;
    local_3f0 = (long *)*plVar3;
  }
  paVar2 = &local_430.field_2;
  local_3e8 = plVar3[1];
  *plVar3 = (long)plVar11;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  psVar10 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_410.field_2._M_allocated_capacity = *psVar10;
    local_410.field_2._8_8_ = plVar3[3];
    local_410._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_410.field_2._M_allocated_capacity = *psVar10;
    local_410._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_410._M_string_length = plVar3[1];
  *plVar3 = (long)psVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_410,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  psVar10 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430.field_2._8_8_ = plVar3[3];
    local_430._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_430._M_string_length = plVar3[1];
  *plVar3 = (long)psVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = puVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != paVar1) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  local_430._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::ofstream(&local_230,(string *)&local_430,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_2f0,local_2e8);
  genTupleStructs_abi_cxx11_(&local_430,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_430._M_dataplus._M_p,local_430._M_string_length);
  genCaseIdentifiers_abi_cxx11_(&local_410,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_410._M_dataplus._M_p,local_410._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != paVar1) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  uVar13 = 0;
  while( true ) {
    sVar6 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar6 <= uVar13) break;
    local_3d0 = &local_3c0;
    std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x03');
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d0);
    local_3f0 = &local_3e0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_3e0 = *plVar3;
      lStack_3d8 = puVar4[3];
    }
    else {
      local_3e0 = *plVar3;
      local_3f0 = (long *)*puVar4;
    }
    local_3e8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    pTVar7 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar13);
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_3f0,(ulong)(pTVar7->_name)._M_dataplus._M_p);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    psVar10 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410.field_2._8_8_ = puVar4[3];
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_410._M_string_length = puVar4[1];
    *puVar4 = psVar10;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_410);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    psVar10 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_430.field_2._M_allocated_capacity = *psVar10;
      local_430.field_2._8_8_ = puVar4[3];
    }
    else {
      local_430.field_2._M_allocated_capacity = *psVar10;
      local_430._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_430._M_string_length = puVar4[1];
    *puVar4 = psVar10;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,local_430._M_dataplus._M_p,local_430._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0);
    }
    uVar13 = uVar13 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n",0x28);
  paVar1 = &local_430.field_2;
  std::ofstream::close();
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  genTupleStructConstructors_abi_cxx11_(&local_430,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_430._M_dataplus._M_p,local_430._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  return;
}

Assistant:

void CppGenerator::genDataHandler()
{
    std::string header = std::string("#ifndef INCLUDE_DATAHANDLER_HPP_\n")+
        "#define INCLUDE_DATAHANDLER_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    header += "#include <parallel/algorithm>\n";
#endif

    if (MICRO_BENCH)
    {
        header += "#define INIT_MICRO_BENCH(timer)\\\n"+offset(1)+
            "auto begin_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+
            "auto finish_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"std::chrono::duration<double>  elapsed_##timer = "+
            "finish_##timer - begin_##timer;\\\n"+
            offset(1)+"double time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"double global_time_##timer = 0;\n";

        header += std::string("#define BEGIN_MICRO_BENCH(timer) begin_##timer = ")+
            "std::chrono::high_resolution_clock::now();\n";
        header += std::string("#define END_MICRO_BENCH(timer) finish_##timer = ")+
            "std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"elapsed_##timer = finish_##timer - begin_##timer;\\\n"+
            offset(1)+"time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"global_time_##timer += time_spent_##timer;\n";

        header += std::string("#define PRINT_MICRO_BENCH(timer) std::cout << ")+
            "#timer << \": \" << std::to_string(global_time_##timer) << std::endl;\n\n";
    }
    
    header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"const std::string PATH_TO_DATA = \""+PATH_TO_DATA+"\";\n\n";

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.h", std::ofstream::out);

    ofs << header << genTupleStructs() << genCaseIdentifiers() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << offset(1)+"extern void sort"+_td->getRelation(relID)->_name+"();\n";
    
    ofs <<  "}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.cpp", std::ofstream::out);
    ofs << genTupleStructConstructors() << std::endl;
    ofs.close();
}